

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

string * __thiscall
Json::Value::getComment_abi_cxx11_
          (string *__return_storage_ptr__,Value *this,CommentPlacement placement)

{
  char *pcVar1;
  allocator local_9;
  
  if ((this->comments_ == (CommentInfo *)0x0) ||
     (pcVar1 = this->comments_[placement].comment_, pcVar1 == (char *)0x0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Value::getComment(CommentPlacement placement) const {
  if (hasComment(placement))
    return comments_[placement].comment_;
  return "";
}